

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.h
# Opt level: O0

void __thiscall Pool::Pool(Pool *this,string *name,int depth)

{
  allocator<Edge_*> local_29;
  _func_bool_Edge_ptr_Edge_ptr *local_28;
  int local_1c;
  string *psStack_18;
  int depth_local;
  string *name_local;
  Pool *this_local;
  
  local_1c = depth;
  psStack_18 = name;
  name_local = &this->name_;
  std::__cxx11::string::string((string *)this,(string *)name);
  this->current_use_ = 0;
  this->depth_ = local_1c;
  local_28 = WeightedEdgeCmp;
  std::allocator<Edge_*>::allocator(&local_29);
  std::set<Edge_*,_bool_(*)(const_Edge_*,_const_Edge_*),_std::allocator<Edge_*>_>::set
            (&this->delayed_,&local_28,&local_29);
  std::allocator<Edge_*>::~allocator(&local_29);
  return;
}

Assistant:

Pool(const std::string& name, int depth)
    : name_(name), current_use_(0), depth_(depth), delayed_(&WeightedEdgeCmp) {}